

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_length_byte_array_decoder.cpp
# Opt level: O0

void __thiscall
duckdb::DeltaLengthByteArrayDecoder::SkipInternal<false>
          (DeltaLengthByteArrayDecoder *this,uint8_t *defines,idx_t skip_count)

{
  undefined8 uVar1;
  ulong in_RDX;
  long in_RDI;
  idx_t row_idx;
  idx_t skip_bytes;
  uint32_t *length_data;
  ResizeableBuffer *block;
  uint64_t in_stack_ffffffffffffff78;
  ByteBuffer *in_stack_ffffffffffffff80;
  allocator *paVar2;
  ulong local_70;
  allocator local_49;
  unsigned_long in_stack_ffffffffffffffb8;
  unsigned_long in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  IOException *in_stack_ffffffffffffffd0;
  
  shared_ptr<duckdb::ResizeableBuffer,_true>::operator*
            ((shared_ptr<duckdb::ResizeableBuffer,_true> *)in_stack_ffffffffffffff80);
  if (*(ulong *)(in_RDI + 0x10) < *(long *)(in_RDI + 0x18) + in_RDX) {
    uVar1 = __cxa_allocate_exception(0x10);
    paVar2 = &local_49;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffb8,
               "DELTA_LENGTH_BYTE_ARRAY - length mismatch between values and byte array lengths (attempted read of %d from %d entries) - corrupt file?"
               ,paVar2);
    IOException::IOException<unsigned_long,unsigned_long>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffb8);
    __cxa_throw(uVar1,&IOException::typeinfo,IOException::~IOException);
  }
  for (local_70 = 0; local_70 < in_RDX; local_70 = local_70 + 1) {
    *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
  }
  ByteBuffer::inc(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  return;
}

Assistant:

void DeltaLengthByteArrayDecoder::SkipInternal(uint8_t *defines, idx_t skip_count) {
	auto &block = *reader.block;
	const auto length_data = reinterpret_cast<uint32_t *>(length_buffer.ptr);

	if (!HAS_DEFINES) {
		// Fast path: take this out of the loop below
		if (length_idx + skip_count > byte_array_count) {
			throw IOException(
			    "DELTA_LENGTH_BYTE_ARRAY - length mismatch between values and byte array lengths (attempted "
			    "read of %d from %d entries) - corrupt file?",
			    length_idx + skip_count, byte_array_count);
		}
	}

	idx_t skip_bytes = 0;
	for (idx_t row_idx = 0; row_idx < skip_count; row_idx++) {
		if (HAS_DEFINES) {
			if (defines[row_idx] != reader.MaxDefine()) {
				continue;
			}
			if (length_idx >= byte_array_count) {
				throw IOException(
				    "DELTA_LENGTH_BYTE_ARRAY - length mismatch between values and byte array lengths (attempted "
				    "read of %d from %d entries) - corrupt file?",
				    length_idx, byte_array_count);
			}
		}
		skip_bytes += length_data[length_idx++];
	}
	block.inc(skip_bytes);
}